

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::IsUpperTriangular(Matrix *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long local_58;
  Fraction local_38;
  
  local_58 = 0x18;
  uVar4 = 0;
  while (iVar1 = this->m_, (long)uVar4 < (long)iVar1) {
    uVar6 = uVar4 & 0xffffffff;
    lVar7 = local_58;
    while (uVar5 = (int)uVar6 + 1, uVar6 = (ulong)uVar5, (int)uVar5 < this->n_) {
      lVar2 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar7);
      lVar7 = lVar7 + 0x18;
      Fraction::Fraction(&local_38,0);
      bVar3 = operator!=((Fraction *)(lVar2 + uVar4 * 8),&local_38);
      if (bVar3) goto LAB_00109a50;
    }
    local_58 = local_58 + 0x18;
    uVar4 = uVar4 + 1;
  }
LAB_00109a50:
  return (long)iVar1 <= (long)uVar4;
}

Assistant:

bool Matrix::IsUpperTriangular() const {
  for (int column = 0; column < m_; ++column) {
    for (int row = column + 1; row < n_; ++row) {
      if (elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}